

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgloadr.c
# Opt level: O1

FT_Error FT_GlyphLoader_CheckPoints(FT_GlyphLoader loader,FT_UInt n_points,FT_UInt n_contours)

{
  bool bVar1;
  FT_Error FVar2;
  FT_Vector *pFVar3;
  char *pcVar4;
  short *psVar5;
  ulong new_count;
  FT_Memory memory;
  uint uVar6;
  uint uVar7;
  ulong cur_count;
  FT_Error error;
  FT_Error error_1;
  FT_Error local_48;
  FT_UInt local_44;
  FT_Memory local_40;
  FT_Error local_34;
  
  memory = loader->memory;
  local_48 = 0;
  uVar6 = (int)(loader->base).outline.n_points + n_points + (int)(loader->current).outline.n_points;
  uVar7 = loader->max_points;
  cur_count = (ulong)uVar7;
  if (uVar7 < uVar6) {
    uVar6 = uVar6 + 7;
    if (0x7fff < uVar6) {
      return 10;
    }
    uVar6 = uVar6 & 0xfffffff8;
    new_count = (ulong)uVar6;
    local_44 = n_contours;
    pFVar3 = (FT_Vector *)
             ft_mem_realloc(memory,0x10,cur_count,new_count,(loader->base).outline.points,&local_48)
    ;
    (loader->base).outline.points = pFVar3;
    if (local_48 != 0) goto LAB_0013239a;
    local_34 = 0;
    local_40 = memory;
    pcVar4 = (char *)ft_mem_qrealloc(memory,1,cur_count,new_count,(loader->base).outline.tags,
                                     &local_34);
    FVar2 = local_34;
    if (uVar7 < uVar6 && local_34 == 0) {
      memset(pcVar4 + cur_count,0,new_count - cur_count);
    }
    local_48 = FVar2;
    (loader->base).outline.tags = pcVar4;
    if (FVar2 != 0) goto LAB_0013239a;
    if (loader->use_extra != '\0') {
      pFVar3 = (FT_Vector *)
               ft_mem_realloc(local_40,0x10,(ulong)(uVar7 * 2),(ulong)(uVar6 * 2),
                              (loader->base).extra_points,&local_48);
      (loader->base).extra_points = pFVar3;
      if (local_48 != 0) goto LAB_0013239a;
      memmove(pFVar3 + new_count,pFVar3 + cur_count,cur_count * 0x10);
      (loader->base).extra_points2 = (loader->base).extra_points + new_count;
    }
    loader->max_points = uVar6;
    bVar1 = true;
    memory = local_40;
    n_contours = local_44;
  }
  else {
    bVar1 = false;
  }
  uVar7 = (int)(loader->base).outline.n_contours + n_contours +
          (int)(loader->current).outline.n_contours;
  if (loader->max_contours < uVar7) {
    uVar7 = uVar7 + 3;
    if (0x7fff < uVar7) {
      return 10;
    }
    uVar7 = uVar7 & 0xfffffffc;
    psVar5 = (short *)ft_mem_realloc(memory,2,(ulong)loader->max_contours,(ulong)uVar7,
                                     (loader->base).outline.contours,&local_48);
    (loader->base).outline.contours = psVar5;
    if (local_48 != 0) goto LAB_0013239a;
    loader->max_contours = uVar7;
    bVar1 = true;
  }
  if (bVar1) {
    FT_GlyphLoader_Adjust_Points(loader);
  }
LAB_0013239a:
  FVar2 = local_48;
  if (local_48 != 0) {
    FT_GlyphLoader_Reset(loader);
  }
  return FVar2;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_GlyphLoader_CheckPoints( FT_GlyphLoader  loader,
                              FT_UInt         n_points,
                              FT_UInt         n_contours )
  {
    FT_Memory    memory  = loader->memory;
    FT_Error     error   = FT_Err_Ok;
    FT_Outline*  base    = &loader->base.outline;
    FT_Outline*  current = &loader->current.outline;
    FT_Bool      adjust  = 0;

    FT_UInt      new_max, old_max;


    /* check points & tags */
    new_max = (FT_UInt)base->n_points + (FT_UInt)current->n_points +
              n_points;
    old_max = loader->max_points;

    if ( new_max > old_max )
    {
      new_max = FT_PAD_CEIL( new_max, 8 );

      if ( new_max > FT_OUTLINE_POINTS_MAX )
        return FT_THROW( Array_Too_Large );

      if ( FT_RENEW_ARRAY( base->points, old_max, new_max ) ||
           FT_RENEW_ARRAY( base->tags,   old_max, new_max ) )
        goto Exit;

      if ( loader->use_extra )
      {
        if ( FT_RENEW_ARRAY( loader->base.extra_points,
                             old_max * 2, new_max * 2 ) )
          goto Exit;

        FT_ARRAY_MOVE( loader->base.extra_points + new_max,
                       loader->base.extra_points + old_max,
                       old_max );

        loader->base.extra_points2 = loader->base.extra_points + new_max;
      }

      adjust = 1;
      loader->max_points = new_max;
    }

    /* check contours */
    old_max = loader->max_contours;
    new_max = (FT_UInt)base->n_contours + (FT_UInt)current->n_contours +
              n_contours;
    if ( new_max > old_max )
    {
      new_max = FT_PAD_CEIL( new_max, 4 );

      if ( new_max > FT_OUTLINE_CONTOURS_MAX )
        return FT_THROW( Array_Too_Large );

      if ( FT_RENEW_ARRAY( base->contours, old_max, new_max ) )
        goto Exit;

      adjust = 1;
      loader->max_contours = new_max;
    }

    if ( adjust )
      FT_GlyphLoader_Adjust_Points( loader );

  Exit:
    if ( error )
      FT_GlyphLoader_Reset( loader );

    return error;
  }